

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_avx2.c
# Opt level: O0

void load_buffer_8x8_avx2(int16_t *input,__m256i *out,int stride,int flipud,int fliplr,int shift)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined8 *puVar18;
  int in_ECX;
  int in_EDX;
  undefined1 (*in_RSI) [32];
  undefined1 (*pauVar19) [32];
  undefined8 *in_RDI;
  int in_R8D;
  uint in_R9D;
  __m128i x;
  __m128i x_00;
  __m128i x_01;
  __m128i x_02;
  __m128i x_03;
  __m128i x_04;
  __m128i x_05;
  __m128i x_06;
  __m128i out1 [8];
  undefined8 local_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 local_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 local_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 local_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  
  if (in_ECX == 0) {
    local_450 = *in_RDI;
    uStack_448 = in_RDI[1];
    puVar18 = (undefined8 *)((long)in_RDI + (long)in_EDX * 2);
    local_440 = *puVar18;
    uStack_438 = puVar18[1];
    puVar18 = (undefined8 *)((long)in_RDI + (long)(in_EDX << 1) * 2);
    local_430 = *puVar18;
    uStack_428 = puVar18[1];
    puVar18 = (undefined8 *)((long)in_RDI + (long)(in_EDX * 3) * 2);
    local_420 = *puVar18;
    uStack_418 = puVar18[1];
    puVar18 = (undefined8 *)((long)in_RDI + (long)(in_EDX << 2) * 2);
    local_410 = *puVar18;
    uStack_408 = puVar18[1];
    puVar18 = (undefined8 *)((long)in_RDI + (long)(in_EDX * 5) * 2);
    local_400 = *puVar18;
    uStack_3f8 = puVar18[1];
    puVar18 = (undefined8 *)((long)in_RDI + (long)(in_EDX * 6) * 2);
    local_3f0 = *puVar18;
    uStack_3e8 = puVar18[1];
    puVar18 = (undefined8 *)((long)in_RDI + (long)(in_EDX * 7) * 2);
    local_3e0 = *puVar18;
    uStack_3d8 = puVar18[1];
  }
  else {
    local_3e0 = *in_RDI;
    uStack_3d8 = in_RDI[1];
    puVar18 = (undefined8 *)((long)in_RDI + (long)in_EDX * 2);
    local_3f0 = *puVar18;
    uStack_3e8 = puVar18[1];
    puVar18 = (undefined8 *)((long)in_RDI + (long)(in_EDX << 1) * 2);
    local_400 = *puVar18;
    uStack_3f8 = puVar18[1];
    puVar18 = (undefined8 *)((long)in_RDI + (long)(in_EDX * 3) * 2);
    local_410 = *puVar18;
    uStack_408 = puVar18[1];
    puVar18 = (undefined8 *)((long)in_RDI + (long)(in_EDX << 2) * 2);
    local_420 = *puVar18;
    uStack_418 = puVar18[1];
    puVar18 = (undefined8 *)((long)in_RDI + (long)(in_EDX * 5) * 2);
    local_430 = *puVar18;
    uStack_428 = puVar18[1];
    puVar18 = (undefined8 *)((long)in_RDI + (long)(in_EDX * 6) * 2);
    local_440 = *puVar18;
    uStack_438 = puVar18[1];
    puVar18 = (undefined8 *)((long)in_RDI + (long)(in_EDX * 7) * 2);
    local_450 = *puVar18;
    uStack_448 = puVar18[1];
  }
  if (in_R8D == 0) {
    auVar17._8_8_ = uStack_448;
    auVar17._0_8_ = local_450;
    auVar1 = vpmovsxwd_avx2(auVar17);
    *in_RSI = auVar1;
    auVar16._8_8_ = uStack_438;
    auVar16._0_8_ = local_440;
    auVar1 = vpmovsxwd_avx2(auVar16);
    in_RSI[1] = auVar1;
    auVar15._8_8_ = uStack_428;
    auVar15._0_8_ = local_430;
    auVar1 = vpmovsxwd_avx2(auVar15);
    in_RSI[2] = auVar1;
    auVar14._8_8_ = uStack_418;
    auVar14._0_8_ = local_420;
    auVar1 = vpmovsxwd_avx2(auVar14);
    in_RSI[3] = auVar1;
    auVar13._8_8_ = uStack_408;
    auVar13._0_8_ = local_410;
    auVar1 = vpmovsxwd_avx2(auVar13);
    in_RSI[4] = auVar1;
    auVar12._8_8_ = uStack_3f8;
    auVar12._0_8_ = local_400;
    auVar1 = vpmovsxwd_avx2(auVar12);
    in_RSI[5] = auVar1;
    auVar11._8_8_ = uStack_3e8;
    auVar11._0_8_ = local_3f0;
    auVar1 = vpmovsxwd_avx2(auVar11);
    in_RSI[6] = auVar1;
    auVar10._8_8_ = uStack_3d8;
    auVar10._0_8_ = local_3e0;
    auVar1 = vpmovsxwd_avx2(auVar10);
    in_RSI[7] = auVar1;
  }
  else {
    x[1] = (longlong)in_RSI;
    x[0] = (longlong)in_RDI;
    pauVar19 = in_RSI;
    mm_reverse_epi16(x);
    auVar9._8_8_ = uStack_448;
    auVar9._0_8_ = local_450;
    auVar1 = vpmovsxwd_avx2(auVar9);
    *in_RSI = auVar1;
    x_00[1] = (longlong)pauVar19;
    x_00[0] = (longlong)in_RDI;
    mm_reverse_epi16(x_00);
    auVar8._8_8_ = uStack_438;
    auVar8._0_8_ = local_440;
    auVar1 = vpmovsxwd_avx2(auVar8);
    in_RSI[1] = auVar1;
    x_01[1] = (longlong)pauVar19;
    x_01[0] = (longlong)in_RDI;
    mm_reverse_epi16(x_01);
    auVar7._8_8_ = uStack_428;
    auVar7._0_8_ = local_430;
    auVar1 = vpmovsxwd_avx2(auVar7);
    in_RSI[2] = auVar1;
    x_02[1] = (longlong)pauVar19;
    x_02[0] = (longlong)in_RDI;
    mm_reverse_epi16(x_02);
    auVar6._8_8_ = uStack_418;
    auVar6._0_8_ = local_420;
    auVar1 = vpmovsxwd_avx2(auVar6);
    in_RSI[3] = auVar1;
    x_03[1] = (longlong)pauVar19;
    x_03[0] = (longlong)in_RDI;
    mm_reverse_epi16(x_03);
    auVar5._8_8_ = uStack_408;
    auVar5._0_8_ = local_410;
    auVar1 = vpmovsxwd_avx2(auVar5);
    in_RSI[4] = auVar1;
    x_04[1] = (longlong)pauVar19;
    x_04[0] = (longlong)in_RDI;
    mm_reverse_epi16(x_04);
    auVar4._8_8_ = uStack_3f8;
    auVar4._0_8_ = local_400;
    auVar1 = vpmovsxwd_avx2(auVar4);
    in_RSI[5] = auVar1;
    x_05[1] = (longlong)pauVar19;
    x_05[0] = (longlong)in_RDI;
    mm_reverse_epi16(x_05);
    auVar3._8_8_ = uStack_3e8;
    auVar3._0_8_ = local_3f0;
    auVar1 = vpmovsxwd_avx2(auVar3);
    in_RSI[6] = auVar1;
    x_06[1] = (longlong)pauVar19;
    x_06[0] = (longlong)in_RDI;
    mm_reverse_epi16(x_06);
    auVar2._8_8_ = uStack_3d8;
    auVar2._0_8_ = local_3e0;
    auVar1 = vpmovsxwd_avx2(auVar2);
    in_RSI[7] = auVar1;
  }
  auVar1 = vpslld_avx2(*in_RSI,ZEXT416(in_R9D));
  *in_RSI = auVar1;
  auVar1 = vpslld_avx2(in_RSI[1],ZEXT416(in_R9D));
  in_RSI[1] = auVar1;
  auVar1 = vpslld_avx2(in_RSI[2],ZEXT416(in_R9D));
  in_RSI[2] = auVar1;
  auVar1 = vpslld_avx2(in_RSI[3],ZEXT416(in_R9D));
  in_RSI[3] = auVar1;
  auVar1 = vpslld_avx2(in_RSI[4],ZEXT416(in_R9D));
  in_RSI[4] = auVar1;
  auVar1 = vpslld_avx2(in_RSI[5],ZEXT416(in_R9D));
  in_RSI[5] = auVar1;
  auVar1 = vpslld_avx2(in_RSI[6],ZEXT416(in_R9D));
  in_RSI[6] = auVar1;
  auVar1 = vpslld_avx2(in_RSI[7],ZEXT416(in_R9D));
  in_RSI[7] = auVar1;
  return;
}

Assistant:

static inline void load_buffer_8x8_avx2(const int16_t *input, __m256i *out,
                                        int stride, int flipud, int fliplr,
                                        int shift) {
  __m128i out1[8];
  if (!flipud) {
    out1[0] = _mm_load_si128((const __m128i *)(input + 0 * stride));
    out1[1] = _mm_load_si128((const __m128i *)(input + 1 * stride));
    out1[2] = _mm_load_si128((const __m128i *)(input + 2 * stride));
    out1[3] = _mm_load_si128((const __m128i *)(input + 3 * stride));
    out1[4] = _mm_load_si128((const __m128i *)(input + 4 * stride));
    out1[5] = _mm_load_si128((const __m128i *)(input + 5 * stride));
    out1[6] = _mm_load_si128((const __m128i *)(input + 6 * stride));
    out1[7] = _mm_load_si128((const __m128i *)(input + 7 * stride));

  } else {
    out1[7] = _mm_load_si128((const __m128i *)(input + 0 * stride));
    out1[6] = _mm_load_si128((const __m128i *)(input + 1 * stride));
    out1[5] = _mm_load_si128((const __m128i *)(input + 2 * stride));
    out1[4] = _mm_load_si128((const __m128i *)(input + 3 * stride));
    out1[3] = _mm_load_si128((const __m128i *)(input + 4 * stride));
    out1[2] = _mm_load_si128((const __m128i *)(input + 5 * stride));
    out1[1] = _mm_load_si128((const __m128i *)(input + 6 * stride));
    out1[0] = _mm_load_si128((const __m128i *)(input + 7 * stride));
  }
  if (!fliplr) {
    out[0] = _mm256_cvtepi16_epi32(out1[0]);
    out[1] = _mm256_cvtepi16_epi32(out1[1]);
    out[2] = _mm256_cvtepi16_epi32(out1[2]);
    out[3] = _mm256_cvtepi16_epi32(out1[3]);
    out[4] = _mm256_cvtepi16_epi32(out1[4]);
    out[5] = _mm256_cvtepi16_epi32(out1[5]);
    out[6] = _mm256_cvtepi16_epi32(out1[6]);
    out[7] = _mm256_cvtepi16_epi32(out1[7]);

  } else {
    out[0] = _mm256_cvtepi16_epi32(mm_reverse_epi16(out1[0]));
    out[1] = _mm256_cvtepi16_epi32(mm_reverse_epi16(out1[1]));
    out[2] = _mm256_cvtepi16_epi32(mm_reverse_epi16(out1[2]));
    out[3] = _mm256_cvtepi16_epi32(mm_reverse_epi16(out1[3]));
    out[4] = _mm256_cvtepi16_epi32(mm_reverse_epi16(out1[4]));
    out[5] = _mm256_cvtepi16_epi32(mm_reverse_epi16(out1[5]));
    out[6] = _mm256_cvtepi16_epi32(mm_reverse_epi16(out1[6]));
    out[7] = _mm256_cvtepi16_epi32(mm_reverse_epi16(out1[7]));
  }
  out[0] = _mm256_slli_epi32(out[0], shift);
  out[1] = _mm256_slli_epi32(out[1], shift);
  out[2] = _mm256_slli_epi32(out[2], shift);
  out[3] = _mm256_slli_epi32(out[3], shift);
  out[4] = _mm256_slli_epi32(out[4], shift);
  out[5] = _mm256_slli_epi32(out[5], shift);
  out[6] = _mm256_slli_epi32(out[6], shift);
  out[7] = _mm256_slli_epi32(out[7], shift);
}